

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchCachedBitState
               (int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  Prog *pPVar1;
  bool bVar2;
  ostream *poVar3;
  LogMessage local_4e0;
  int local_35c;
  undefined1 local_358 [4];
  int i;
  Prog *local_1d8;
  Prog *prog;
  LogMessage local_1c0;
  StringPiece local_40;
  Regexp *local_30;
  Regexp *re;
  bool expect_match_local;
  StringPiece *pSStack_20;
  Anchor anchor_local;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re._3_1_ = expect_match;
  re._4_4_ = anchor;
  pSStack_20 = text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  StringPiece::StringPiece(&local_40,regexp);
  local_30 = Regexp::Parse(&local_40,LikePerl,(RegexpStatus *)0x0);
  if (local_30 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3f3);
    poVar3 = LogMessage::stream(&local_1c0);
    std::operator<<(poVar3,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0);
  }
  local_1d8 = Regexp::CompileToProg(local_30,0);
  if (local_1d8 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3f5);
    poVar3 = LogMessage::stream((LogMessage *)local_358);
    std::operator<<(poVar3,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_358);
  }
  for (local_35c = 0; pPVar1 = local_1d8, local_35c < regexp_local._4_4_; local_35c = local_35c + 1)
  {
    bVar2 = Prog::SearchBitState
                      (local_1d8,pSStack_20,pSStack_20,re._4_4_,kFirstMatch,(StringPiece *)0x0,0);
    if (bVar2 != (bool)(re._3_1_ & 1)) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3f8);
      poVar3 = LogMessage::stream(&local_4e0);
      std::operator<<(poVar3,
                      "Check failed: (prog->SearchBitState(text, text, anchor, Prog::kFirstMatch, __null, 0)) == (expect_match)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4e0);
    }
  }
  if (local_1d8 != (Prog *)0x0) {
    Prog::~Prog(local_1d8);
    operator_delete(pPVar1);
  }
  Regexp::Decref(local_30);
  return;
}

Assistant:

void SearchCachedBitState(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  for (int i = 0; i < iters; i++)
    CHECK_EQ(prog->SearchBitState(text, text, anchor, Prog::kFirstMatch, NULL, 0),
             expect_match);
  delete prog;
  re->Decref();
}